

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall.c
# Opt level: O0

void * metacallfmv_await_s(void *func,void **keys,void **values,size_t size,
                          _func_void_ptr_void_ptr_void_ptr *resolve_callback,
                          _func_void_ptr_void_ptr_void_ptr *reject_callback,void *data)

{
  int iVar1;
  type_id tVar2;
  type_id tVar3;
  signature s_00;
  type ptVar4;
  value pvVar5;
  function_return pvVar6;
  value in_RCX;
  long in_RDX;
  long in_RSI;
  function_conflict in_RDI;
  value cast_ret;
  type_id id_1;
  type t_1;
  value cast_arg;
  type_id id;
  type t;
  int key_index;
  value cast_key;
  char *key;
  size_t index;
  type_id key_id;
  value ret;
  size_t iterator;
  signature s;
  void *args [16];
  function f;
  char *in_stack_fffffffffffffeb0;
  signature in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  type_id in_stack_fffffffffffffec4;
  size_t in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  function_conflict in_stack_fffffffffffffed8;
  ulong local_f0;
  undefined8 in_stack_ffffffffffffff20;
  value v;
  undefined8 local_c8 [15];
  function_return local_8;
  
  if (in_RDI == (function_conflict)0x0) {
    local_8 = (function_return)0x0;
  }
  else {
    s_00 = function_signature(in_RDI);
    for (v = (value)0x0; v < in_RCX; v = (value)((long)v + 1)) {
      iVar1 = value_validate(in_stack_fffffffffffffeb0);
      if (iVar1 != 0) {
        log_write_impl_va("metacall",0x6c6,"metacallfmv_await_s",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/metacall/source/metacall.c"
                          ,LOG_LEVEL_ERROR,
                          "Invalid key at position %zu when calling to metacallfmv_await_s",v);
        return (void *)0x0;
      }
      iVar1 = value_validate(in_stack_fffffffffffffeb0);
      if (iVar1 != 0) {
        log_write_impl_va("metacall",0x6cd,"metacallfmv_await_s",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/metacall/source/metacall.c"
                          ,LOG_LEVEL_ERROR,
                          "Invalid value at position %zu when calling to metacallfmv_await_s",v);
        return (void *)0x0;
      }
      tVar2 = value_type_id((value)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
      local_f0 = 0x10;
      iVar1 = type_id_string(tVar2);
      if (iVar1 == 0) {
        value_to_string((value)0x138c34);
        local_f0 = signature_get_index(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      }
      else {
        iVar1 = type_id_integer(tVar2);
        if (iVar1 == 0) {
          pvVar5 = value_type_cast(v,(type_id)((ulong)in_stack_ffffffffffffff20 >> 0x20));
          if (pvVar5 != (value)0x0) {
            *(value *)(in_RSI + (long)v * 8) = pvVar5;
          }
          iVar1 = value_to_int(in_stack_fffffffffffffeb0);
          if ((-1 < iVar1) && (iVar1 < 0x10)) {
            local_f0 = (ulong)iVar1;
          }
        }
      }
      if (0xf < local_f0) {
        return (void *)0x0;
      }
      ptVar4 = signature_get_type(in_stack_fffffffffffffeb8,(size_t)in_stack_fffffffffffffeb0);
      if (ptVar4 != (type)0x0) {
        in_stack_fffffffffffffec4 = type_index(ptVar4);
        tVar2 = value_type_id((value)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
        if ((in_stack_fffffffffffffec4 != tVar2) &&
           (pvVar5 = value_type_cast(v,(type_id)((ulong)in_stack_ffffffffffffff20 >> 0x20)),
           pvVar5 != (value)0x0)) {
          *(value *)(in_RDX + (long)v * 8) = pvVar5;
        }
      }
      local_c8[local_f0] = *(undefined8 *)(in_RDX + (long)v * 8);
    }
    pvVar6 = function_await(in_stack_fffffffffffffed8,
                            (void **)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                            in_stack_fffffffffffffec8,
                            (function_resolve_callback)
                            CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                            (function_reject_callback)in_stack_fffffffffffffeb8,
                            in_stack_fffffffffffffeb0);
    local_8 = pvVar6;
    if ((pvVar6 != (function_return)0x0) &&
       (ptVar4 = signature_get_return(s_00), local_8 = pvVar6, ptVar4 != (type)0x0)) {
      tVar2 = type_index(ptVar4);
      tVar3 = value_type_id((value)CONCAT44(in_stack_fffffffffffffec4,tVar2));
      local_8 = pvVar6;
      if ((tVar2 != tVar3) &&
         (local_8 = value_type_cast(v,(type_id)((ulong)pvVar6 >> 0x20)), local_8 == (value)0x0)) {
        local_8 = pvVar6;
      }
    }
  }
  return local_8;
}

Assistant:

void *metacallfmv_await_s(void *func, void *keys[], void *values[], size_t size, void *(*resolve_callback)(void *, void *), void *(*reject_callback)(void *, void *), void *data)
{
	function f = (function)func;

	if (f != NULL)
	{
		void *args[METACALL_ARGS_SIZE];

		signature s = function_signature(f);

		size_t iterator;

		value ret;

		for (iterator = 0; iterator < size; ++iterator)
		{
			if (value_validate(keys[iterator]) != 0)
			{
				// TODO: Implement type error return a value
				log_write("metacall", LOG_LEVEL_ERROR, "Invalid key at position %" PRIuS " when calling to metacallfmv_await_s", iterator);
				return NULL;
			}

			if (value_validate(values[iterator]) != 0)
			{
				// TODO: Implement type error return a value
				log_write("metacall", LOG_LEVEL_ERROR, "Invalid value at position %" PRIuS " when calling to metacallfmv_await_s", iterator);
				return NULL;
			}

			type_id key_id = value_type_id((value)keys[iterator]);

			size_t index = METACALL_ARGS_SIZE;

			/* Obtain signature index */
			if (type_id_string(key_id) == 0)
			{
				const char *key = value_to_string(keys[iterator]);

				index = signature_get_index(s, key);
			}
			else if (type_id_integer(key_id) == 0)
			{
				value cast_key = value_type_cast((value)keys[iterator], TYPE_INT);

				int key_index;

				if (cast_key != NULL)
				{
					keys[iterator] = cast_key;
				}

				key_index = value_to_int((value)keys[iterator]);

				if (key_index >= 0 && key_index < METACALL_ARGS_SIZE)
				{
					index = (size_t)key_index;
				}
			}

			/* If index is valid, cast values and build arguments */
			if (index < METACALL_ARGS_SIZE)
			{
				type t = signature_get_type(s, iterator);

				if (t != NULL)
				{
					type_id id = type_index(t);

					if (id != value_type_id((value)values[iterator]))
					{
						value cast_arg = value_type_cast((value)values[iterator], id);

						if (cast_arg != NULL)
						{
							values[iterator] = cast_arg;
						}
					}
				}

				args[index] = values[iterator];
			}
			else
			{
				/* TODO: Handle properly exceptions */
				return NULL;
			}
		}

		ret = function_await(f, args, size, resolve_callback, reject_callback, data);

		if (ret != NULL)
		{
			type t = signature_get_return(s);

			if (t != NULL)
			{
				type_id id = type_index(t);

				if (id != value_type_id(ret))
				{
					value cast_ret = value_type_cast(ret, id);

					return (cast_ret == NULL) ? ret : cast_ret;
				}
			}
		}

		return ret;
	}

	return NULL;
}